

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyword_validator.hpp
# Opt level: O0

walk_result __thiscall
jsoncons::jsonschema::
min_contains_keyword<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
::validate(min_contains_keyword<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
           *this,eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                 *context,json_pointer *instance_location,size_t count,error_reporter *reporter)

{
  json_pointer *pjVar1;
  ulong in_RCX;
  undefined8 in_RDX;
  keyword_base<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
  *in_RDI;
  walk_result result;
  string message;
  eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  this_context;
  validation_message *in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd80;
  walk_result in_stack_fffffffffffffd84;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda4;
  uint uVar2;
  eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *in_stack_fffffffffffffda8;
  eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *in_stack_fffffffffffffdb0;
  unsigned_long in_stack_fffffffffffffdb8;
  string local_138 [32];
  string local_118 [32];
  string local_f8 [48];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  local_68;
  ulong local_28;
  undefined8 local_20;
  walk_result local_4;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  keyword_base<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>::
  keyword_name_abi_cxx11_(in_RDI);
  eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  ::eval_context(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
                 (string *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
  if (local_28 < *(ulong *)(in_RDI + 0xe0)) {
    std::__cxx11::to_string(in_stack_fffffffffffffdb8);
    std::operator+((char *)in_stack_fffffffffffffd88,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
    std::operator+(in_stack_fffffffffffffd88,
                   (char *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
    std::__cxx11::string::~string(local_a8);
    std::__cxx11::string::~string(local_c8);
    std::__cxx11::to_string(in_stack_fffffffffffffdb8);
    std::operator+((char *)in_stack_fffffffffffffd88,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
    std::operator+(in_stack_fffffffffffffd88,
                   (char *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
    std::__cxx11::string::append(local_88);
    std::__cxx11::string::~string(local_f8);
    std::__cxx11::string::~string(local_118);
    std::__cxx11::string::~string(local_138);
    pjVar1 = eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
             ::eval_path(&local_68);
    (**(code **)(*(long *)in_RDI + 0x10))(&stack0xfffffffffffffda8,in_RDI,pjVar1,local_20,local_88);
    in_stack_fffffffffffffd84 =
         error_reporter::error
                   ((error_reporter *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                    in_stack_fffffffffffffd78);
    validation_message::~validation_message
              ((validation_message *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
    if (in_stack_fffffffffffffd84 == abort) {
      local_4 = abort;
    }
    uVar2 = (uint)(in_stack_fffffffffffffd84 == abort);
    std::__cxx11::string::~string(local_88);
    if (uVar2 != 0) goto LAB_0074cdbb;
  }
  local_4 = advance;
LAB_0074cdbb:
  eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  ::~eval_context((eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                   *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
  return local_4;
}

Assistant:

walk_result validate(const eval_context<Json>& context, 
            const jsonpointer::json_pointer& instance_location,
            std::size_t count, 
            error_reporter& reporter) const 
        {
            eval_context<Json> this_context(context, this->keyword_name());

            if (count < min_value_)
            {
                std::string message("A schema must match a contains constraint at least " + std::to_string(min_value_) + " times");
                message.append(" but it matched " + std::to_string(count) + " times.");
                walk_result result = reporter.error(this->make_validation_message(
                    this_context.eval_path(),
                    instance_location, 
                    std::move(message)));
                if (result == walk_result::abort)
                {
                    return result;
                }
            }
            return walk_result::advance;
        }